

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O0

void __thiscall
jaegertracing::Span::Span
          (Span *this,shared_ptr<const_jaegertracing::Tracer> *tracer,SpanContext *context,
          string *operationName,time_point *startTimeSystem,time_point *startTimeSteady,
          vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *tags,
          vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *references)

{
  time_point *startTimeSteady_local;
  time_point *startTimeSystem_local;
  string *operationName_local;
  SpanContext *context_local;
  shared_ptr<const_jaegertracing::Tracer> *tracer_local;
  Span *this_local;
  
  opentracing::v3::Span::Span(&this->super_Span);
  (this->super_Span)._vptr_Span = (_func_int **)&PTR__Span_004f9388;
  std::shared_ptr<const_jaegertracing::Tracer>::shared_ptr(&this->_tracer,tracer);
  SpanContext::SpanContext(&this->_context,context);
  std::__cxx11::string::string((string *)&this->_operationName,(string *)operationName);
  (this->_startTimeSystem).__d.__r = (startTimeSystem->__d).__r;
  (this->_startTimeSteady).__d.__r = (startTimeSteady->__d).__r;
  (this->_duration).__r = 0;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector(&this->_tags,tags);
  std::vector<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_>::vector
            (&this->_logs);
  std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::vector
            (&this->_references,references);
  std::mutex::mutex(&this->_mutex);
  return;
}

Assistant:

explicit Span(
        const std::shared_ptr<const Tracer>& tracer = nullptr,
        const SpanContext& context = SpanContext(),
        const std::string& operationName = "",
        const SystemClock::time_point& startTimeSystem = SystemClock::now(),
        const SteadyClock::time_point& startTimeSteady = SteadyClock::now(),
        const std::vector<Tag>& tags = {},
        const std::vector<Reference>& references = {})
        : _tracer(tracer)
        , _context(context)
        , _operationName(operationName)
        , _startTimeSystem(startTimeSystem)
        , _startTimeSteady(startTimeSteady)
        , _duration()
        , _tags(tags)
        , _references(references)
    {
    }